

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.hpp
# Opt level: O2

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 pstore::to_base64<unsigned_char_const*,std::back_insert_iterator<std::__cxx11::string>>
           (uchar *first,uchar *last,
           back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           out)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long lVar5;
  long lVar6;
  byte *pbVar7;
  byte *pbVar8;
  char cVar9;
  char *str;
  bool bVar10;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  byte *local_48;
  byte *local_40;
  long local_38;
  
  lVar5 = ((long)last - (long)first) / 3;
  local_38 = ((long)last - (long)first) % 3;
  lVar6 = 0;
  if (0 < lVar5) {
    lVar6 = lVar5;
  }
  pbVar7 = first + 1;
  local_50 = out.container;
  local_40 = last;
  while (pbVar4 = local_50, bVar10 = lVar6 != 0, lVar6 = lVar6 + -1, bVar10) {
    bVar1 = pbVar7[-1];
    bVar2 = *pbVar7;
    bVar3 = pbVar7[1];
    local_58.container = out.container;
    local_48 = pbVar7;
    std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(&local_58,
                to_base64<const_unsigned_char_*,_std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::alphabet._M_elems + (bVar1 >> 2));
    local_58.container = out.container;
    std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(&local_58,
                to_base64<const_unsigned_char_*,_std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::alphabet._M_elems + (((uint)bVar2 * 0x100 | (uint)bVar1 << 0x10) >> 0xc & 0x3f));
    local_58.container = out.container;
    std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(&local_58,
                to_base64<const_unsigned_char_*,_std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::alphabet._M_elems + ((uint)bVar2 * 0x100 + (uint)bVar3 >> 6 & 0x3f));
    pbVar7 = local_48;
    local_58.container = out.container;
    std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(&local_58,
                to_base64<const_unsigned_char_*,_std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::alphabet._M_elems + (bVar3 & 0x3f));
    pbVar7 = pbVar7 + 3;
  }
  cVar9 = (char)local_50;
  if (local_38 == 2) {
    bVar1 = pbVar7[-1];
    bVar2 = *pbVar7;
    pbVar8 = pbVar7 + 1;
    local_58.container = local_50;
    std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(&local_58,
                to_base64<const_unsigned_char_*,_std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::alphabet._M_elems + (bVar1 >> 2));
    local_58.container = pbVar4;
    std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(&local_58,
                to_base64<const_unsigned_char_*,_std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::alphabet._M_elems + (((uint)bVar2 << 8 | (uint)bVar1 << 0x10) >> 0xc & 0x3f));
    local_58.container = pbVar4;
    std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(&local_58,
                to_base64<const_unsigned_char_*,_std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::alphabet._M_elems + (ulong)(bVar2 & 0xf) * 4);
LAB_00126d48:
    std::__cxx11::string::push_back(cVar9);
  }
  else {
    pbVar8 = pbVar7 + -1;
    if (local_38 == 1) {
      bVar1 = *pbVar8;
      local_58.container = local_50;
      std::
      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator=(&local_58,
                  to_base64<const_unsigned_char_*,_std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::alphabet._M_elems + (bVar1 >> 2));
      local_58.container = pbVar4;
      std::
      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator=(&local_58,
                  to_base64<const_unsigned_char_*,_std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::alphabet._M_elems + ((bVar1 & 3) << 4));
      std::__cxx11::string::push_back(cVar9);
      pbVar8 = pbVar7;
      goto LAB_00126d48;
    }
    if (local_38 != 0) {
      str = "false";
      line = 0x4e;
      goto LAB_00126d7f;
    }
  }
  if (pbVar8 == local_40) {
    return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )pbVar4;
  }
  str = "first == last";
  line = 0x51;
LAB_00126d7f:
  assert_failed(str,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/base64.hpp"
                ,line);
}

Assistant:

OutputIterator to_base64 (ForwardIterator first, ForwardIterator last, OutputIterator out) {
        static constexpr std::array<char, 64> alphabet{
            {'A', 'B', 'C', 'D', 'E', 'F', 'G', 'H', 'I', 'J', 'K', 'L', 'M', 'N', 'O', 'P',
             'Q', 'R', 'S', 'T', 'U', 'V', 'W', 'X', 'Y', 'Z', 'a', 'b', 'c', 'd', 'e', 'f',
             'g', 'h', 'i', 'j', 'k', 'l', 'm', 'n', 'o', 'p', 'q', 'r', 's', 't', 'u', 'v',
             'w', 'x', 'y', 'z', '0', '1', '2', '3', '4', '5', '6', '7', '8', '9', '+', '/'}};
        auto const size = std::distance (first, last);
        // Consume the input, converting three input bytes to four output characters.
        for (auto index = decltype (size){0}; index < size / 3; ++index) {
            auto value1 = static_cast<std::uint32_t> (*(first++) << 16);
            value1 += static_cast<std::uint32_t> (*(first++) << 8);
            value1 += static_cast<std::uint32_t> (*(first++));

            *(out++) = alphabet[(value1 & 0x00FC0000) >> 18];
            *(out++) = alphabet[(value1 & 0x0003F000) >> 12];
            *(out++) = alphabet[(value1 & 0x00000FC0) >> 6];
            *(out++) = alphabet[value1 & 0x0000003F];
        }

        // Deal with the remaining 0..2 characters.
        switch (size % 3) {
        case 0: break;
        case 1: {
            auto const value2 = static_cast<std::uint32_t> (*(first++) << 16);

            *(out++) = alphabet[(value2 & 0x00FC0000) >> 18];
            *(out++) = alphabet[(value2 & 0x0003F000) >> 12];
            *(out++) = '=';
            *(out++) = '=';
        } break;
        case 2: {
            auto value3 = static_cast<std::uint32_t> (*(first++) << 16);
            value3 += static_cast<std::uint32_t> (*(first++) << 8);

            *(out++) = alphabet[(value3 & 0x00FC0000) >> 18];
            *(out++) = alphabet[(value3 & 0x0003F000) >> 12];
            *(out++) = alphabet[(value3 & 0x00000FC0) >> 6];
            *(out++) = '=';
        } break;
        default:
            PSTORE_ASSERT (false); //! OCLINT(PH - don't warn about a conditional constant)
            break;
        }
        PSTORE_ASSERT (first == last);
        return out;
    }